

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

bool __thiscall QIODevice::seek(QIODevice *this,qint64 pos)

{
  long lVar1;
  bool bVar2;
  QIODevicePrivate *this_00;
  long in_RSI;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  QIODevicePrivate *d;
  OpenModeFlag in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QIODevice *)0x13a36f);
  bVar2 = QIODevicePrivate::isSequential
                    ((QIODevicePrivate *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar2) {
    checkWarnMessage(in_RDI,"seek","Cannot call seek on a sequential device");
    local_31 = false;
  }
  else {
    bVar2 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                         SUB84((ulong)in_RDI >> 0x20,0),in_stack_ffffffffffffffa0);
    if (bVar2) {
      checkWarnMessage(in_RDI,"seek","The device is not open");
      local_31 = false;
    }
    else if (in_RSI < 0) {
      local_31 = false;
    }
    else {
      this_00->devicePos = in_RSI;
      QIODevicePrivate::seekBuffer(this_00,(qint64)in_RDI);
      local_31 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool QIODevice::seek(qint64 pos)
{
    Q_D(QIODevice);
    if (d->isSequential()) {
        checkWarnMessage(this, "seek", "Cannot call seek on a sequential device");
        return false;
    }
    if (d->openMode == NotOpen) {
        checkWarnMessage(this, "seek", "The device is not open");
        return false;
    }
    if (pos < 0) {
        qWarning("QIODevice::seek: Invalid pos: %lld", pos);
        return false;
    }

#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::seek(%lld), before: d->pos = %lld, d->buffer.size() = %lld\n",
           this, pos, d->pos, d->buffer.size());
#endif

    d->devicePos = pos;
    d->seekBuffer(pos);

#if defined QIODEVICE_DEBUG
    printf("%p \tafter: d->pos == %lld, d->buffer.size() == %lld\n", this, d->pos,
           d->buffer.size());
#endif
    return true;
}